

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  EnumVal *pEVar1;
  string *psVar2;
  pointer ppEVar3;
  PythonStubGenerator *pPVar4;
  string result;
  string sStack_c8;
  Import *local_a8;
  string local_a0;
  string *local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_c8,"typing",(allocator<char> *)&local_a0);
  Imports::Import(imports,&sStack_c8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  if (*(char *)(*(long *)this + 0x3f8) == '\x01') {
    anon_unknown_0::PythonStubGenerator::ModuleForFile
              (&sStack_c8,(PythonStubGenerator *)this,&(enum_def->super_Definition).file);
  }
  else {
    IdlNamer::NamespacedType_abi_cxx11_
              (&sStack_c8,(IdlNamer *)(this + 8),&enum_def->super_Definition);
  }
  pPVar4 = this + 8;
  (**(code **)(*(long *)(this + 8) + 0x78))(&local_a0,pPVar4,enum_def);
  local_a8 = Imports::Import(imports,&sStack_c8,&local_a0);
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_c8,"",(allocator<char> *)&local_a0);
  local_78 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_a8 = (Import *)&local_a8->name;
  for (ppEVar3 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar3 != local_78;
      ppEVar3 = ppEVar3 + 1) {
    pEVar1 = *ppEVar3;
    if (sStack_c8._M_string_length != 0) {
      std::__cxx11::string::append((char *)&sStack_c8);
    }
    std::operator+(&local_50,&local_a8->module,".");
    (**(code **)(*(long *)pPVar4 + 0x98))(&local_70,pPVar4,pEVar1);
    std::operator+(&local_a0,&local_50,&local_70);
    std::__cxx11::string::append((string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(&local_a0,"typing.Literal[",&sStack_c8);
  psVar2 = local_80;
  std::operator+(local_80,&local_a0,"]");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&sStack_c8);
  return psVar2;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }